

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O0

void __thiscall ImplSimd<SimdAVX>::AlphaBlend(ImplSimd<SimdAVX> *this,RGB *rgb,uint8_t alpha)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint8_t *in_RSI;
  uint8_t *src;
  undefined8 extraout_XMM0_Qa;
  uint8_t *dst;
  VectorType *a;
  VectorType *a_00;
  VectorType *palVar4;
  Vector e;
  Vector d;
  Vector c;
  size_t i;
  Vector const_alpha;
  uint8_t *b;
  uint8_t *g;
  uint8_t *r;
  undefined8 in_stack_fffffffffffffe40;
  int imm8;
  VectorType *in_stack_fffffffffffffe48;
  VectorType *in_stack_fffffffffffffe50;
  uint8_t *in_stack_fffffffffffffea8;
  VectorType *in_stack_fffffffffffffeb0;
  ulong local_88;
  
  if ((*(ulong *)(in_RSI + 0x10) & 0xf) == 0) {
    lVar1 = *(long *)(in_RSI + 0x18);
    lVar2 = *(long *)(in_RSI + 0x20);
    lVar3 = *(long *)(in_RSI + 0x28);
    src = in_RSI;
    SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    for (local_88 = 0; local_88 < *(ulong *)(in_RSI + 0x10); local_88 = local_88 + 0x10) {
      SimdAVX::Load((VectorType *)(lVar1 + local_88),src);
      SimdAVX::Load((VectorType *)(lVar2 + local_88),src);
      SimdAVX::Load((VectorType *)(lVar3 + local_88),src);
      SimdAVX::Mul(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      imm8 = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
      SimdAVX::Rli(in_stack_fffffffffffffe48,imm8);
      a_00 = (VectorType *)0x0;
      SimdAVX::Store(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      SimdAVX::Mul(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      SimdAVX::Rli(in_stack_fffffffffffffe48,imm8);
      palVar4 = (VectorType *)0x0;
      in_stack_fffffffffffffea8 = dst;
      SimdAVX::Store(a_00,dst);
      SimdAVX::Mul(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe48 = a;
      SimdAVX::Rli(a,(int)((ulong)extraout_XMM0_Qa >> 0x20));
      src = (uint8_t *)(lVar3 + local_88);
      SimdAVX::Store(a_00,in_stack_fffffffffffffea8);
      SimdAVX::Empty();
      in_stack_fffffffffffffe40 = extraout_XMM0_Qa;
      in_stack_fffffffffffffe50 = palVar4;
      in_stack_fffffffffffffeb0 = a_00;
    }
    return;
  }
  __assert_fail("rgb->size_ % kStride == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x5b,"virtual void ImplSimd<SimdAVX>::AlphaBlend(RGB *, uint8_t) [SIMD = SimdAVX]")
  ;
}

Assistant:

void ImplSimd<SIMD>::AlphaBlend(RGB *rgb, uint8_t alpha) {
  assert(rgb->size_ % kStride == 0);

  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  Vector const_alpha = cn(alpha);

  for(size_t i = 0; i < rgb->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);
    /*
    r[i] = (uint32_t)alpha * r[i] >> 8;
    g[i] = (uint32_t)alpha * g[i] >> 8;
    b[i] = (uint32_t)alpha * b[i] >> 8;
     */
    store(rli(mul(const_alpha, c),8),r+i);
    store(rli(mul(const_alpha, d),8),g+i);
    store(rli(mul(const_alpha, e),8),b+i);
    SIMD::Empty();
  }
}